

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O2

void duckdb_je_tcache_stats_merge(tsdn_t *tsdn,tcache_t *tcache,arena_t *arena)

{
  uint64_t *puVar1;
  long *plVar2;
  bin_t *mutex;
  long lVar3;
  ulong uVar4;
  
  lVar3 = 0x10;
  for (uVar4 = 0; uVar4 < tcache->tcache_slow->tcache_nbins; uVar4 = uVar4 + 1) {
    if (*(uintptr_t **)((long)tcache->bins + lVar3 + -0x10) != &duckdb_je_disabled_bin) {
      if (uVar4 < 0x24) {
        mutex = duckdb_je_arena_bin_choose(tsdn,arena,(szind_t)uVar4,(uint *)0x0);
        malloc_mutex_lock(tsdn,&mutex->lock);
        puVar1 = &(mutex->stats).nrequests;
        *puVar1 = *puVar1 + *(long *)((long)tcache->bins + lVar3 + -8);
        (mutex->lock).field_0.field_0.locked.repr = false;
        pthread_mutex_unlock((pthread_mutex_t *)((long)&(mutex->lock).field_0 + 0x48));
      }
      else {
        LOCK();
        plVar2 = (long *)((long)arena + lVar3 * 2 + -0x2f0);
        *plVar2 = *plVar2 + *(long *)((long)tcache->bins + lVar3 + -8);
        UNLOCK();
        LOCK();
        plVar2 = (long *)((long)arena + lVar3 * 2 + -0x2e0);
        *plVar2 = *plVar2 + 1;
        UNLOCK();
      }
      *(undefined8 *)((long)tcache->bins + lVar3 + -8) = 0;
    }
    lVar3 = lVar3 + 0x18;
  }
  return;
}

Assistant:

void
tcache_stats_merge(tsdn_t *tsdn, tcache_t *tcache, arena_t *arena) {
	cassert(config_stats);

	/* Merge and reset tcache stats. */
	for (unsigned i = 0; i < tcache_nbins_get(tcache->tcache_slow); i++) {
		cache_bin_t *cache_bin = &tcache->bins[i];
		if (tcache_bin_disabled(i, cache_bin, tcache->tcache_slow)) {
			continue;
		}
		if (i < SC_NBINS) {
			bin_t *bin = arena_bin_choose(tsdn, arena, i, NULL);
			malloc_mutex_lock(tsdn, &bin->lock);
			bin->stats.nrequests += cache_bin->tstats.nrequests;
			malloc_mutex_unlock(tsdn, &bin->lock);
		} else {
			arena_stats_large_flush_nrequests_add(tsdn,
			    &arena->stats, i, cache_bin->tstats.nrequests);
		}
		cache_bin->tstats.nrequests = 0;
	}
}